

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O3

void remove_inform_from_list
               (list<InformItem_*,_std::allocator<InformItem_*>_> *list,
               function<bool_(InformItem_*)> *predicate)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  InformItem *__ptr;
  bool bVar3;
  undefined8 uVar4;
  _List_node_base *p_Var5;
  list<InformItem_*,_std::allocator<InformItem_*>_> __to_destroy;
  _List_node_base local_50;
  long local_40;
  InformItem *local_38;
  
  local_50._M_next = &local_50;
  local_40 = 0;
  p_Var5 = (list->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)list) {
    local_50._M_prev = local_50._M_next;
    do {
      p_Var2 = p_Var5->_M_next;
      __ptr = (InformItem *)p_Var5[1]._M_next;
      local_38 = __ptr;
      if ((predicate->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar4 = std::__throw_bad_function_call();
        p_Var5 = local_50._M_next;
        while (p_Var5 != &local_50) {
          p_Var2 = p_Var5->_M_next;
          operator_delete(p_Var5);
          p_Var5 = p_Var2;
        }
        _Unwind_Resume(uVar4);
      }
      bVar3 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_38);
      if ((bVar3) &&
         (free(__ptr), p_Var5->_M_next != local_50._M_next && local_50._M_next != p_Var5)) {
        std::__detail::_List_node_base::_M_transfer(local_50._M_next,p_Var5);
        local_40 = local_40 + 1;
        psVar1 = &(list->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
      }
      p_Var5 = p_Var2;
    } while (p_Var2 != (_List_node_base *)list);
    p_Var5 = local_50._M_next;
    while (p_Var5 != &local_50) {
      p_Var2 = p_Var5->_M_next;
      operator_delete(p_Var5);
      p_Var5 = p_Var2;
    }
  }
  return;
}

Assistant:

static void remove_inform_from_list(std::list<struct InformItem *> &list,
                             std::function<bool(struct InformItem *)> predicate) {
    list.remove_if([&predicate](struct InformItem* item){
        if(predicate(item)){
            delete_inform(item);
            return true;
        }
        return false;
    });
}